

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

ImplicitCallFlags
Js::JavascriptOperators::CheckAndUpdateFunctionBodyWithImplicitFlag(FunctionBody *functionBody)

{
  ImplicitCallFlags IVar1;
  ScriptContext *this;
  ThreadContext *this_00;
  ImplicitCallFlags currImplicitCallFlags;
  ScriptContext *scriptContext;
  FunctionBody *functionBody_local;
  
  this = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  this_00 = ScriptContext::GetThreadContext(this);
  IVar1 = ThreadContext::GetImplicitCallFlags(this_00);
  if (ImplicitCall_None < IVar1) {
    ParseableFunctionInfo::SetHasOnlyThisStmts(&functionBody->super_ParseableFunctionInfo,false);
  }
  return IVar1;
}

Assistant:

ImplicitCallFlags
    JavascriptOperators::CheckAndUpdateFunctionBodyWithImplicitFlag(FunctionBody* functionBody)
    {
        ScriptContext* scriptContext = functionBody->GetScriptContext();
        ImplicitCallFlags currImplicitCallFlags = scriptContext->GetThreadContext()->GetImplicitCallFlags();
        if ((currImplicitCallFlags > ImplicitCall_None))
        {
            functionBody->SetHasOnlyThisStmts(false);
        }
        return currImplicitCallFlags;
    }